

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O2

void compress_table(s3ssid_t *uncomp_tab,s3ssid_t *com_tab,s3cipid_t *ci_map,int32 n_ci)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  s3ssid_t sVar4;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)n_ci;
  if (n_ci < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    com_tab[uVar1] = 0xffff;
    ci_map[uVar1] = -1;
  }
  uVar1 = 0;
  do {
    if (uVar1 == uVar2) {
      return;
    }
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      sVar4 = uncomp_tab[uVar1];
      if (com_tab[uVar3] == 0xffff) goto LAB_0011ff3e;
      if (sVar4 == com_tab[uVar3]) goto LAB_0011ff46;
    }
    sVar4 = uncomp_tab[uVar1];
    uVar3 = uVar1;
LAB_0011ff3e:
    com_tab[uVar3 & 0xffffffff] = sVar4;
LAB_0011ff46:
    ci_map[uVar1] = (s3cipid_t)uVar3;
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

void
compress_table(s3ssid_t * uncomp_tab, s3ssid_t * com_tab,
               s3cipid_t * ci_map, int32 n_ci)
{
    int32 found;
    int32 r;
    int32 tmp_r;

    for (r = 0; r < n_ci; r++) {
        com_tab[r] = BAD_S3SSID;
        ci_map[r] = BAD_S3CIPID;
    }
    /** Compress this map */
    for (r = 0; r < n_ci; r++) {

        found = 0;
        for (tmp_r = 0; tmp_r < r && com_tab[tmp_r] != BAD_S3SSID; tmp_r++) {   /* If it appears before, just filled in cimap; */
            if (uncomp_tab[r] == com_tab[tmp_r]) {
                found = 1;
                ci_map[r] = tmp_r;
                break;
            }
        }

        if (found == 0) {
            com_tab[tmp_r] = uncomp_tab[r];
            ci_map[r] = tmp_r;
        }
    }
}